

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O2

void aalcalcmeanonly::ReadFilesInDirectory(string *path)

{
  bool bVar1;
  DIR *__dirp;
  dirent *pdVar2;
  FILE *__stream;
  int summarySet;
  string *local_78;
  string s;
  int summaryCalcStreamType;
  
  local_78 = path;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) break;
      std::__cxx11::string::string((string *)&s,pdVar2->d_name,(allocator *)&summaryCalcStreamType);
      if (4 < s._M_string_length) {
        std::__cxx11::string::substr((ulong)&summaryCalcStreamType,(ulong)&s);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&summaryCalcStreamType,".bin");
        std::__cxx11::string::~string((string *)&summaryCalcStreamType);
        if (bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &summaryCalcStreamType,local_78,pdVar2->d_name);
          std::__cxx11::string::operator=((string *)&s,(string *)&summaryCalcStreamType);
          std::__cxx11::string::~string((string *)&summaryCalcStreamType);
          __stream = fopen(s._M_dataplus._M_p,"rb");
          if (__stream == (FILE *)0x0) {
            fprintf(_stderr,"FATAL: %s: cannot open %s\n","ReadFilesInDirectory",s._M_dataplus._M_p)
            ;
LAB_00102828:
            exit(1);
          }
          summaryCalcStreamType = 0;
          fread((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &summaryCalcStreamType,4,1,__stream);
          if (summaryCalcStreamType != 0x3000001) {
            fprintf(_stderr,"FATAL: %s: invalid stream type %d\n","ReadFilesInDirectory");
            goto LAB_00102828;
          }
          fread(&sampleSize_,4,1,__stream);
          summarySet = 0;
          fread(&summarySet,4,1,__stream);
          ReadInputStream((FILE *)__stream);
          fclose(__stream);
        }
      }
      std::__cxx11::string::~string((string *)&s);
    }
  }
  return;
}

Assistant:

void ReadFilesInDirectory(const std::string& path) {

    DIR *dir = nullptr;
    struct dirent *ent = nullptr;
    if ((dir = opendir(path.c_str())) != nullptr) {
      while ((ent = readdir(dir)) != nullptr) {
        std::string s = ent->d_name;
	if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
	  s = path + ent->d_name;
	  FILE *fin = fopen(s.c_str(), "rb");
	  if (fin == nullptr) {
	    fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, s.c_str());
	    exit(EXIT_FAILURE);
	  }
	  int summaryCalcStreamType = 0;
	  fread(&summaryCalcStreamType, sizeof(summaryCalcStreamType), 1, fin);
	  if (summaryCalcStreamType != (summarycalc_id | 1)) {
	    fprintf(stderr, "FATAL: %s: invalid stream type %d\n", __func__,
		    summaryCalcStreamType);
	    exit(EXIT_FAILURE);
	  }
	  fread(&sampleSize_, sizeof(sampleSize_), 1, fin);
	  int summarySet = 0;
	  fread(&summarySet, sizeof(summarySet), 1, fin);

	  ReadInputStream(fin);

	  fclose(fin);

	}

      }

    }

  }